

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O1

int __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
::shutdown(dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
           *this,int __fd,int __how)

{
  _Head_base<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_false> _Var1;
  pointer ppcVar2;
  condition_t *pcVar3;
  int iVar4;
  
  _Var1._M_head_impl =
       (this->m_queue).m_lock._M_t.
       super___uniq_ptr_impl<so_5::disp::mpmc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
       .super__Head_base<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_lock_t[2])(_Var1._M_head_impl);
  (this->m_queue).m_shutdown = true;
  while ((this->m_queue).m_waiting_customers.
         super__Vector_base<so_5::disp::mpmc_queue_traits::condition_t_*,_std::allocator<so_5::disp::mpmc_queue_traits::condition_t_*>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->m_queue).m_waiting_customers.
         super__Vector_base<so_5::disp::mpmc_queue_traits::condition_t_*,_std::allocator<so_5::disp::mpmc_queue_traits::condition_t_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    ppcVar2 = (this->m_queue).m_waiting_customers.
              super__Vector_base<so_5::disp::mpmc_queue_traits::condition_t_*,_std::allocator<so_5::disp::mpmc_queue_traits::condition_t_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pcVar3 = ppcVar2[-1];
    (this->m_queue).m_waiting_customers.
    super__Vector_base<so_5::disp::mpmc_queue_traits::condition_t_*,_std::allocator<so_5::disp::mpmc_queue_traits::condition_t_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppcVar2 + -1;
    (this->m_queue).m_wakeup_in_progress = true;
    (*pcVar3->_vptr_condition_t[3])();
  }
  iVar4 = (*(_Var1._M_head_impl)->_vptr_lock_t[3])(_Var1._M_head_impl);
  return iVar4;
}

Assistant:

virtual void
		shutdown() override
			{
				m_queue.shutdown();
			}